

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaInfo.cpp
# Opt level: O2

DOMElement * __thiscall
xercesc_4_0::SchemaInfo::getTopLevelComponent
          (SchemaInfo *this,unsigned_short compCategory,XMLCh *compName,XMLCh *name)

{
  _func_int **pp_Var1;
  XMLCh *str2;
  bool bVar2;
  int iVar3;
  DOMElement *pDVar4;
  RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  DOMElement *child;
  DOMNode *local_48;
  DOMNode *local_40;
  XMLCh *local_38;
  DOMNode *pDVar5;
  
  if ((compCategory < 7 && &this->fSchemaRootElement->super_DOMNode != (DOMNode *)0x0) &&
     (pDVar4 = XUtil::getFirstChildElement(&this->fSchemaRootElement->super_DOMNode),
     pDVar4 != (DOMElement *)0x0)) {
    this_00 = this->fTopLevelComponents[compCategory];
    child = pDVar4;
    if (this_00 == (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)0x0) {
      local_40 = (DOMNode *)this->fMemoryManager;
      this_00 = (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)
                XMemory::operator_new(0x38,(MemoryManager *)local_40);
      RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher>::RefHashTableOf
                (this_00,0x11,false,this->fMemoryManager);
      this->fTopLevelComponents[compCategory] = this_00;
    }
    else {
      pDVar4 = RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher>::get(this_00,name)
      ;
      if (pDVar4 != (DOMElement *)0x0) {
        return pDVar4;
      }
      pDVar4 = this->fLastTopLevelComponent[compCategory];
      child = pDVar4;
    }
    local_38 = name;
    iVar3 = (*(pDVar4->super_DOMNode)._vptr_DOMNode[5])(pDVar4);
    pDVar5 = (DOMNode *)CONCAT44(extraout_var,iVar3);
    iVar3 = (*pDVar5->_vptr_DOMNode[0x18])(pDVar5);
    bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_00,iVar3),
                              (XMLCh *)SchemaSymbols::fgELT_REDEFINE);
    str2 = local_38;
    local_40 = pDVar5;
    if (!bVar2) {
      local_40 = (DOMNode *)0x0;
    }
    while (pDVar4 != (DOMElement *)0x0) {
      this->fLastTopLevelComponent[compCategory] = pDVar4;
      iVar3 = (*(pDVar4->super_DOMNode)._vptr_DOMNode[0x18])(pDVar4);
      bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_01,iVar3),compName);
      pp_Var1 = (child->super_DOMNode)._vptr_DOMNode;
      if (bVar2) {
        iVar3 = (*pp_Var1[0x29])(child,SchemaSymbols::fgATT_NAME);
        RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher>::put
                  (this_00,(XMLCh *)CONCAT44(extraout_var_02,iVar3),child);
        bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_02,iVar3),str2);
        if (bVar2) {
          return child;
        }
      }
      else {
        iVar3 = (*pp_Var1[0x18])();
        bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_03,iVar3),
                                  (XMLCh *)SchemaSymbols::fgELT_REDEFINE);
        if ((bVar2) &&
           ((this->fFailedRedefineList == (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)0x0 ||
            (bVar2 = ValueVectorOf<const_xercesc_4_0::DOMElement_*>::containsElement
                               (this->fFailedRedefineList,&child,0), !bVar2)))) {
          for (local_48 = &XUtil::getFirstChildElement(&child->super_DOMNode)->super_DOMNode;
              local_48 != (DOMNode *)0x0;
              local_48 = &XUtil::getNextSiblingElement(local_48)->super_DOMNode) {
            this->fLastTopLevelComponent[compCategory] = (DOMElement *)local_48;
            if ((this->fFailedRedefineList == (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)0x0)
               || (bVar2 = ValueVectorOf<const_xercesc_4_0::DOMElement_*>::containsElement
                                     (this->fFailedRedefineList,(DOMElement **)&local_48,0), !bVar2)
               ) {
              iVar3 = (*((DOMNode *)&local_48->_vptr_DOMNode)->_vptr_DOMNode[0x18])(local_48);
              bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_04,iVar3),compName);
              if (bVar2) {
                iVar3 = (*((DOMNode *)&local_48->_vptr_DOMNode)->_vptr_DOMNode[0x29])
                                  (local_48,SchemaSymbols::fgATT_NAME);
                RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher>::put
                          (this_00,(XMLCh *)CONCAT44(extraout_var_05,iVar3),(DOMElement *)local_48);
                bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_05,iVar3),str2);
                if (bVar2) {
                  return (DOMElement *)local_48;
                }
              }
            }
          }
        }
      }
      pDVar4 = XUtil::getNextSiblingElement(&child->super_DOMNode);
      child = pDVar4;
      if ((pDVar4 == (DOMElement *)0x0) && (local_40 != (DOMNode *)0x0)) {
        pDVar4 = XUtil::getNextSiblingElement(local_40);
        local_40 = (DOMNode *)0x0;
        child = pDVar4;
      }
    }
  }
  return (DOMElement *)0x0;
}

Assistant:

DOMElement*
SchemaInfo::getTopLevelComponent(const unsigned short compCategory,
                                 const XMLCh* const compName,
                                 const XMLCh* const name) {

    if (fSchemaRootElement == 0 || compCategory >= C_Count)
      return 0;

    DOMElement* child = XUtil::getFirstChildElement(fSchemaRootElement);

    if (!child)
        return 0;

    RefHashTableOf<DOMElement>* compList = fTopLevelComponents[compCategory];

    if (fTopLevelComponents[compCategory] == 0) {

        compList= new (fMemoryManager) RefHashTableOf<DOMElement>(17, false, fMemoryManager);
        fTopLevelComponents[compCategory] = compList;
    }
    else {
        DOMElement* cachedChild = compList->get(name);
        if(cachedChild)
            return cachedChild;

        child = fLastTopLevelComponent[compCategory];
    }

    DOMElement* redefParent = (DOMElement*) child->getParentNode();

    // Parent is not "redefine"
    if (!XMLString::equals(redefParent->getLocalName(),SchemaSymbols::fgELT_REDEFINE))
        redefParent = 0;

    while (child != 0) {

        fLastTopLevelComponent[compCategory]=child;
        if (XMLString::equals(child->getLocalName(), compName)) {

            const XMLCh* cName=child->getAttribute(SchemaSymbols::fgATT_NAME);
            compList->put((void*)cName, child);

            if (XMLString::equals(cName, name))
                return child;
        }
        else if (XMLString::equals(child->getLocalName(),SchemaSymbols::fgELT_REDEFINE)
                 && (!fFailedRedefineList || !fFailedRedefineList->containsElement(child))) { // if redefine

            DOMElement* redefineChild = XUtil::getFirstChildElement(child);

            while (redefineChild != 0) {

                fLastTopLevelComponent[compCategory]=redefineChild;
                if ((!fFailedRedefineList || !fFailedRedefineList->containsElement(redefineChild))
                    && XMLString::equals(redefineChild->getLocalName(), compName)) {

                    const XMLCh* rName=redefineChild->getAttribute(SchemaSymbols::fgATT_NAME);
                    compList->put((void*)rName, redefineChild);

                    if (XMLString::equals(rName, name))
                        return redefineChild;
                }

                redefineChild = XUtil::getNextSiblingElement(redefineChild);
            }
        }

        child = XUtil::getNextSiblingElement(child);

        if (child == 0 && redefParent) {

            child = XUtil::getNextSiblingElement(redefParent);
            redefParent = 0;
        }
    }

    return child;
}